

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_verify(secp256k1_ge *a)

{
  secp256k1_ge *a_local;
  
  return;
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
#ifdef VERIFY
    secp256k1_fe_verify(&a->x);
    secp256k1_fe_verify(&a->y);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
#endif
    (void)a;
}